

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle_rust.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::debugging_internal::anon_unknown_0::RustSymbolParser::RustSymbolParser
          (RustSymbolParser *this,char *encoding,char *out,char *out_end)

{
  int *local_58;
  char *local_48;
  RustSymbolParser *local_30;
  char *out_end_local;
  char *out_local;
  char *encoding_local;
  RustSymbolParser *this_local;
  
  local_30 = this;
  do {
    local_30->recursion_stack_[0] = kInstantiatingCrate;
    local_30 = (RustSymbolParser *)(local_30->recursion_stack_ + 1);
  } while (local_30 != (RustSymbolParser *)&this->recursion_depth_);
  this->recursion_depth_ = 0;
  local_48 = this->namespace_stack_;
  do {
    *local_48 = '\0';
    local_48 = local_48 + 1;
  } while ((int *)local_48 != &this->namespace_depth_);
  this->namespace_depth_ = 0;
  local_58 = this->position_stack_;
  do {
    *local_58 = 0;
    local_58 = local_58 + 1;
  } while (local_58 != &this->position_depth_);
  this->position_depth_ = 0;
  this->silence_depth_ = 0;
  this->pos_ = 0;
  this->encoding_ = encoding;
  this->out_ = out;
  this->out_end_ = out_end;
  if (this->out_ != this->out_end_) {
    *this->out_ = '\0';
  }
  return;
}

Assistant:

RustSymbolParser(const char* encoding, char* out, char* const out_end)
      : encoding_(encoding), out_(out), out_end_(out_end) {
    if (out_ != out_end_) *out_ = '\0';
  }